

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::DiscardVertex::checkFramebuffer
          (DiscardVertex *this,GLuint primitive_case)

{
  float *pfVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  float *pfVar4;
  long lVar5;
  value_type_conflict2 *__val;
  undefined4 in_register_00000034;
  bool bVar6;
  
  pRVar2 = ((this->super_CaptureVertexInterleaved).m_context)->m_renderCtx;
  iVar3 = (*pRVar2->_vptr_RenderContext[3])(pRVar2,CONCAT44(in_register_00000034,primitive_case));
  pfVar4 = (float *)operator_new(0x10);
  pfVar4[0] = 0.0;
  pfVar4[1] = 0.0;
  pfVar4[2] = 0.0;
  pfVar4[3] = 0.0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,2,2,0x1903,0x1406,pfVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x104b);
  if (ABS(*pfVar4) <= 0.0625) {
    lVar5 = 4;
    do {
      bVar6 = lVar5 == 0x10;
      if (bVar6) break;
      pfVar1 = (float *)((long)pfVar4 + lVar5);
      lVar5 = lVar5 + 4;
    } while (ABS(*pfVar1) <= 0.0625);
  }
  else {
    bVar6 = false;
  }
  operator_delete(pfVar4,0x10);
  return bVar6;
}

Assistant:

bool gl3cts::TransformFeedback::DiscardVertex::checkFramebuffer(glw::GLuint primitive_case UNUSED)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch framebuffer. */
	std::vector<glw::GLfloat> pixels(s_framebuffer_size * s_framebuffer_size);

	if ((s_framebuffer_size > 0) && (s_framebuffer_size > 0))
	{
		gl.readPixels(0, 0, s_framebuffer_size, s_framebuffer_size, GL_RED, GL_FLOAT, pixels.data());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels call failed.");
	}

	/* Check results.
	 Note: assuming that s_buffer_size == 2 -> then all points shall be drawn. */
	for (std::vector<glw::GLfloat>::iterator i = pixels.begin(); i != pixels.end(); ++i)
	{
		if (fabs(*i) > 0.0625f /* precision */)
		{
			return false;
		}
	}

	return true;
}